

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

void wasm::anon_unknown_18::doCodeInlining
               (Module *module,Function *into,InliningAction *action,PassOptions *options)

{
  size_type *psVar1;
  HeapType *this;
  Type *this_00;
  ExpressionList *items;
  Module **__x;
  BranchSeeker *this_01;
  Function *this_02;
  char *pcVar2;
  uintptr_t uVar3;
  Expression **ppEVar4;
  long lVar5;
  undefined1 auVar6 [16];
  Name name_00;
  size_t sVar7;
  PassOptions *pPVar8;
  size_t sVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  Index IVar13;
  uint uVar14;
  Function *pFVar15;
  Drop *left;
  undefined8 *puVar16;
  long *plVar17;
  size_t sVar18;
  Type TVar19;
  mapped_type *pmVar20;
  Block *pBVar21;
  pointer pTVar22;
  LocalSet *pLVar23;
  Break *pBVar24;
  Block *pBVar25;
  Expression *pEVar26;
  undefined1 reuse;
  size_type *psVar27;
  size_t *psVar28;
  ulong uVar29;
  function<bool_(wasm::Name)> *pfVar30;
  Type *pTVar31;
  uint uVar32;
  Function *pFVar33;
  MixedArena *this_03;
  pointer pcVar34;
  pointer pTVar35;
  Type TVar36;
  string *in_R9;
  byte bVar37;
  Name root;
  Name root_00;
  optional<wasm::Type> type_;
  Name root_01;
  optional<wasm::Type> type__00;
  Signature SVar38;
  string_view sVar39;
  Name NVar40;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  initializer_list<wasm::Expression_*> local_338;
  Expression *local_328 [2];
  Expression local_318;
  long *local_308 [2];
  long local_2f8 [2];
  undefined1 auStack_2e8 [8];
  Updater updater;
  NameSet *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_158;
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *pWStack_150;
  code *local_148;
  code *pcStack_140;
  Expression local_130;
  Expression local_120;
  undefined1 auStack_110 [8];
  Name name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Block *local_d0;
  Expression *contents;
  size_type sStack_c0;
  code *local_b8;
  code *pcStack_b0;
  Module *local_a8;
  _Storage<wasm::Type,_true> local_a0;
  undefined1 auStack_98 [8];
  string __str;
  function<bool_(wasm::Name)> *local_50;
  Drop *local_48;
  Expression *old;
  Builder local_38;
  Builder builder;
  
  this_01 = (BranchSeeker *)*action->callSite;
  if (*(char *)&(this_01->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .replacep != '\x06') {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Call]");
  }
  this_02 = action->contents;
  pFVar15 = Module::getFunction(module,(Name)(this_01->
                                             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             ).
                                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             .stack.fixed._M_elems[2]);
  SVar38 = HeapType::getSignature(&pFVar15->type);
  local_a0 = (_Storage<wasm::Type,_true>)SVar38.results.id;
  local_a8 = module;
  local_38.wasm = module;
  left = (Drop *)MixedArena::allocSpace(&module->allocator,0x40,8);
  (left->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = BlockId;
  (left->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  left->value = (Expression *)0x0;
  *(uintptr_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression = 0;
  left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 0;
  left[1].value = (Expression *)0x0;
  *(undefined8 *)&left[2].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression = 0;
  left[2].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
       (uintptr_t)&module->allocator;
  auStack_2e8 = (undefined1  [8])
                &updater.
                 super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .stack;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_2e8,"__inlined_func$","");
  pcVar2 = (this_02->super_Importable).super_Named.name.super_IString.str._M_str;
  psVar1 = &__str._M_string_length;
  auStack_98 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_98,pcVar2,
             pcVar2 + (this_02->super_Importable).super_Named.name.super_IString.str._M_len);
  pcVar34 = (pointer)0xf;
  if (auStack_2e8 !=
      (undefined1  [8])
      &updater.
       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .stack) {
    pcVar34 = (pointer)updater.
                       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .stack.usedFixed;
  }
  TVar36.id = (uintptr_t)
              updater.
              super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .replacep;
  if (pcVar34 < __str._M_dataplus._M_p +
                (long)updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .replacep) {
    pcVar34 = (pointer)0xf;
    if (auStack_98 != (undefined1  [8])psVar1) {
      pcVar34 = (pointer)__str._M_string_length;
    }
    if (pcVar34 < __str._M_dataplus._M_p +
                  (long)updater.
                        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .replacep) goto LAB_008f5318;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)auStack_98,0,(char *)0x0,(ulong)auStack_2e8);
  }
  else {
LAB_008f5318:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append(auStack_2e8,(ulong)auStack_98);
  }
  name_1.super_IString.str._M_str = (char *)&name._M_string_length;
  psVar27 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar27) {
    name._M_string_length = *psVar27;
    name.field_2._M_allocated_capacity = puVar16[3];
  }
  else {
    name._M_string_length = *psVar27;
    name_1.super_IString.str._M_str = (char *)*puVar16;
  }
  name._M_dataplus._M_p = (pointer)puVar16[1];
  *puVar16 = psVar27;
  puVar16[1] = 0;
  *(char *)psVar27 = '\0';
  if (auStack_98 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_98,__str._M_string_length + 1);
  }
  reuse = SUB81(psVar27,0);
  if (auStack_2e8 !=
      (undefined1  [8])
      &updater.
       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .stack) {
    operator_delete((void *)auStack_2e8,
                    updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.usedFixed + 1);
  }
  uVar14 = action->nameHint;
  if (uVar14 != 0) {
    cVar11 = '\x01';
    if (9 < uVar14) {
      uVar32 = uVar14;
      cVar10 = '\x04';
      do {
        cVar11 = cVar10;
        if (uVar32 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_008f5423;
        }
        if (uVar32 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_008f5423;
        }
        if (uVar32 < 10000) goto LAB_008f5423;
        bVar12 = 99999 < uVar32;
        uVar32 = uVar32 / 10000;
        cVar10 = cVar11 + '\x04';
      } while (bVar12);
      cVar11 = cVar11 + '\x01';
    }
LAB_008f5423:
    auStack_98 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct((ulong)auStack_98,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)auStack_98,(uint)__str._M_dataplus._M_p,uVar14);
    plVar17 = (long *)std::__cxx11::string::insert((ulong)auStack_98,0,'\x01');
    auStack_2e8 = (undefined1  [8])
                  &updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack;
    psVar28 = (size_t *)(plVar17 + 2);
    if ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_10UL>
         *)*plVar17 ==
        (SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_10UL>
         *)psVar28) {
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.usedFixed = *psVar28;
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.fixed._M_elems[0].func = (TaskFunc)plVar17[3];
    }
    else {
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.usedFixed = *psVar28;
      auStack_2e8 = (undefined1  [8])*plVar17;
    }
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .replacep = (Expression **)plVar17[1];
    *plVar17 = (long)psVar28;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&name_1.super_IString.str._M_str,(ulong)auStack_2e8);
    reuse = SUB81(psVar28,0);
    if (auStack_2e8 !=
        (undefined1  [8])
        &updater.
         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .stack) {
      operator_delete((void *)auStack_2e8,
                      updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .stack.usedFixed + 1);
    }
    if (auStack_98 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_98,__str._M_string_length + 1);
    }
  }
  sVar39._M_str = (char *)0x0;
  sVar39._M_len = (size_t)name_1.super_IString.str._M_str;
  sVar39 = IString::interned((IString *)name._M_dataplus._M_p,sVar39,(bool)reuse);
  *(string_view *)&left->value = sVar39;
  bVar37 = action->insideATry &
           *(byte *)&(this_01->
                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     ).
                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     .stack.fixed._M_elems[3].func;
  pEVar26 = this_02->body;
  auStack_98 = (undefined1  [8])pEVar26;
  if (sVar39._M_str == (char *)0x0) {
LAB_008f55b4:
    if (bVar37 != 0) goto LAB_008f578c;
    NVar40.super_IString.str._M_str = (char *)pEVar26;
    NVar40.super_IString.str._M_len =
         *(uintptr_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression;
    bVar12 = BranchUtils::BranchSeeker::has(this_01,left->value,NVar40);
    if (!bVar12) goto LAB_008f578c;
  }
  else {
    auStack_2e8 = (undefined1  [8])0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .replacep = (Expression **)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .currFunction = (Function *)0x0;
    updater.module._0_1_ = '\0';
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .currModule._0_1_ = (undefined1)sVar39._M_len;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .currModule._1_7_ = sVar39._M_len._1_7_;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .tryDepth._0_4_ = sVar39._M_str._0_4_;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .tryDepth._4_4_ = sVar39._M_str._4_4_;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_2e8,
               (Expression **)auStack_98);
    cVar11 = (char)updater.module;
    if (updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)updater.
                            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)updater.
                            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
    if (cVar11 == '\0') goto LAB_008f55b4;
  }
  contents = this_02->body;
  updater.localMapping._M_t._M_impl._0_8_ =
       &updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .tryDepth;
  auStack_2e8 = (undefined1  [8])0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .replacep = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currFunction = (Function *)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth._0_4_ = 0;
  updater.module._0_1_ = '\0';
  updater.module._1_7_ = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       updater.localMapping._M_t._M_impl._0_8_;
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
            ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_2e8,
             &contents);
  __x = &updater.
         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .currModule;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)auStack_98,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)__x);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)__x);
  if (updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  if (bVar37 == 0) {
    BranchUtils::BranchAccumulator::get((NameSet *)auStack_2e8,(Expression *)this_01);
  }
  else {
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[0].func = (TaskFunc)&updater;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.usedFixed = 0;
    auStack_2e8 = (undefined1  [8])0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .replacep = (Expression **)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[1].func = (TaskFunc)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[0].currp =
         (Expression **)
         updater.
         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .stack.fixed._M_elems[0].func;
  }
  pEVar26 = left->value;
  uVar3 = *(uintptr_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression
  ;
  pcStack_140 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:497:52)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:497:52)>
              ::_M_manager;
  local_328[0] = &local_318;
  local_158 = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_98;
  pWStack_150 = (Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"_","");
  TVar36.id = (uintptr_t)local_328;
  root.super_IString.str._M_str = (char *)&local_158;
  root.super_IString.str._M_len = uVar3;
  NVar40 = Names::getValidName((Names *)pEVar26,root,(function<bool_(wasm::Name)> *)0x0,
                               (Index)TVar36.id,in_R9);
  *(IString *)&left->value = NVar40.super_IString.str;
  if (local_328[0] != &local_318) {
    operator_delete(local_328[0],local_318._0_8_ + 1);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,3);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_2e8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_98);
LAB_008f578c:
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&updater.localMapping;
  auStack_2e8 = (undefined1  [8])0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .replacep = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currFunction = (Function *)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currModule._0_1_ = 0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currModule._1_7_ = 0;
  updater.localMapping._M_t._M_impl._0_8_ =
       updater.localMapping._M_t._M_impl._0_8_ & 0xffffffff00000000;
  uVar29 = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  updater.returnName.super_IString.str._M_len = 0;
  updater.returnName.super_IString.str._M_str = (char *)0x0;
  updater.options = (PassOptions *)0x0;
  updater.returnCallInfos.
  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.returnCallInfos.
  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth._0_4_ = SUB84(local_a8,0);
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth._4_4_ = (undefined4)((ulong)local_a8 >> 0x20);
  this = &this_02->type;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)into;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  updater.builder = (Builder *)options;
  SVar38 = HeapType::getSignature(this);
  updater.returnName.super_IString.str._M_str = (char *)SVar38.results.id;
  pTVar31 = &(left->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)left->value;
  updater.returnName.super_IString.str._M_len =
       *(size_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression;
  updater.resultType.id._0_1_ =
       *(undefined1 *)
        &(this_01->
         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
         ).
         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
         .stack.fixed._M_elems[3].func;
  updater._304_8_ = &local_38;
  while( true ) {
    auStack_98._0_4_ = (int)uVar29;
    sVar18 = Function::getNumLocals(this_02);
    if (sVar18 <= uVar29) break;
    TVar19 = Function::getLocalType(this_02,auStack_98._0_4_);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = TVar19.id;
    IVar13 = Builder::addVar((Builder *)into,(Function *)0x0,(Name)(auVar6 << 0x40),TVar36);
    pmVar20 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&updater.module,(key_type *)auStack_98);
    *pmVar20 = IVar13;
    uVar29 = (ulong)(auStack_98._0_4_ + 1);
  }
  if (bVar37 == 0) {
    this_00 = &left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type;
    uVar14 = 0;
    while( true ) {
      contents = (Expression *)CONCAT44(contents._4_4_,uVar14);
      SVar38 = HeapType::getSignature(this);
      auStack_98 = (undefined1  [8])SVar38.params.id;
      sVar18 = wasm::Type::size((Type *)auStack_98);
      if (sVar18 <= uVar14) break;
      pmVar20 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&updater.module,(key_type *)&contents);
      if ((this_01->
          super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          ).
          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          .stack.fixed._M_elems[0].currp <= (Expression **)((ulong)contents & 0xffffffff))
      goto LAB_008f6453;
      pLVar23 = Builder::makeLocalSet
                          (&local_38,*pmVar20,
                           *(Expression **)
                            ((this_01->
                             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             ).
                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             .stack.fixed._M_elems[0].func +
                            (long)((ulong)contents & 0xffffffff) * 8));
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                 (Expression *)pLVar23);
      uVar14 = (int)contents + 1;
    }
    pTVar22 = (this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar15 = this_02;
    if ((this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar22) {
      pFVar33 = (Function *)0x0;
      do {
        TVar36.id = pTVar22[(long)pFVar33].id;
        auStack_98 = (undefined1  [8])TVar36.id;
        bVar12 = wasm::Type::isDefaultable((Type *)auStack_98);
        if (bVar12) {
          IVar13 = Function::getVarIndexBase(this_02);
          auStack_98._0_4_ = IVar13 + (int)pFVar33;
          pmVar20 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)&updater.module,(key_type *)auStack_98);
          IVar13 = *pmVar20;
          pEVar26 = LiteralUtils::makeZero(TVar36,local_a8);
          pLVar23 = Builder::makeLocalSet(&local_38,IVar13,pEVar26);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00
                     ,(Expression *)pLVar23);
        }
        pFVar33 = (Function *)(ulong)((int)pFVar33 + 1);
        pTVar22 = (this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar15 = (Function *)
                  ((long)(this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar22 >> 3);
      } while (pFVar33 < pFVar15);
    }
    if (*(char *)&(this_01->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .stack.fixed._M_elems[3].func == '\0') {
      *action->callSite = (Expression *)left;
    }
    else {
      if (action->insideATry == true) {
        __assert_fail("!action.insideATry",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                      ,0x23a,
                      "void wasm::(anonymous namespace)::doCodeInlining(Module *, Function *, const InliningAction &, PassOptions &)"
                     );
      }
      if ((ulong)local_a0 < 2) {
        pEVar26 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar26->_id = ReturnId;
        (pEVar26->type).id = 0;
        *(undefined8 *)(pEVar26 + 1) = 0;
        (pEVar26->type).id = 1;
        *(undefined8 *)(pEVar26 + 1) = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pFVar15;
        pBVar21 = Builder::makeSequence(&local_38,(Expression *)left,pEVar26,type_01);
      }
      else {
        pBVar21 = (Block *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = ReturnId
        ;
        (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
        (pBVar21->name).super_IString.str._M_len = 0;
        (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
        (pBVar21->name).super_IString.str._M_len = (size_t)left;
      }
      *action->callSite = (Expression *)pBVar21;
    }
  }
  else {
    BranchUtils::BranchAccumulator::get((NameSet *)auStack_98,into->body);
    sVar39 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xdff7be),SUB81(uVar29,0));
    uStack_170 = 0;
    pcStack_160 = std::
                  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:522:27)>
                  ::_M_invoke;
    local_168 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:522:27)>
                ::_M_manager;
    local_308[0] = local_2f8;
    local_178 = (NameSet *)auStack_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"_","");
    root_00.super_IString.str._M_str = (char *)&local_178;
    root_00.super_IString.str._M_len = (size_t)sVar39._M_str;
    sVar39 = (string_view)
             Names::getValidName((Names *)sVar39._M_len,root_00,(function<bool_(wasm::Name)> *)0x0,
                                 (Index)local_308,in_R9);
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0],local_2f8[0] + 1);
    }
    if (local_168 != (code *)0x0) {
      (*local_168)(&local_178,&local_178,3);
    }
    if ((ulong)local_a0 < 2) {
      local_130._0_8_ = into->body;
      local_130.type.id = (uintptr_t)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *(undefined1 *)local_130.type.id = 0x13;
      *(undefined8 *)(local_130.type.id + 8) = 0;
      *(undefined8 *)(local_130.type.id + 0x10) = 0;
      *(undefined8 *)(local_130.type.id + 8) = 1;
      *(undefined8 *)(local_130.type.id + 0x10) = 0;
      contents = &local_130;
      sStack_c0 = 2;
      in_R9 = (string *)0x1;
      pBVar21 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          (&local_38,(Name)sVar39,(initializer_list<wasm::Expression_*> *)&contents,
                           (optional<wasm::Type>)(ZEXT816(1) << 0x40));
    }
    else {
      pEVar26 = into->body;
      local_130._0_8_ = MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      ((Expression *)local_130._0_8_)->_id = ReturnId;
      (((Expression *)local_130._0_8_)->type).id = 0;
      *(undefined8 *)(local_130._0_8_ + 0x10) = 0;
      (((Expression *)local_130._0_8_)->type).id = 1;
      *(Expression **)(local_130._0_8_ + 0x10) = pEVar26;
      contents = &local_130;
      sStack_c0 = 1;
      in_R9 = (string *)0x1;
      pBVar21 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          (&local_38,(Name)sVar39,(initializer_list<wasm::Expression_*> *)&contents,
                           (optional<wasm::Type>)(ZEXT816(1) << 0x40));
    }
    into->body = (Expression *)pBVar21;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_a0;
    pBVar21 = Builder::makeSequence(&local_38,into->body,(Expression *)left,type_00);
    into->body = (Expression *)pBVar21;
    SVar38 = HeapType::getSignature(this);
    contents = (Expression *)SVar38.params.id;
    sVar18 = wasm::Type::size((Type *)&contents);
    this_03 = &(local_38.wasm)->allocator;
    if (sVar18 == 0) {
      pBVar21 = (Block *)MixedArena::allocSpace(this_03,0x30,8);
      (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BreakId;
      (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (pBVar21->name).super_IString.str._M_len = 0;
      (pBVar21->name).super_IString.str._M_str = (char *)0x0;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
      (pBVar21->name).super_IString.str = sVar39;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      Break::finalize((Break *)pBVar21);
    }
    else {
      name.field_2._8_8_ = sVar39._M_len;
      pBVar21 = (Block *)MixedArena::allocSpace(this_03,0x40,8);
      (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (pBVar21->name).super_IString.str._M_len = 0;
      (pBVar21->name).super_IString.str._M_str = (char *)0x0;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (pBVar21->list).allocator = this_03;
      contents = (Expression *)((ulong)contents & 0xffffffff00000000);
      do {
        pmVar20 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&updater.module,(key_type *)&contents);
        if ((this_01->
            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            ).
            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            .stack.fixed._M_elems[0].currp <= (Expression **)((ulong)contents & 0xffffffff)) {
LAB_008f6453:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pLVar23 = Builder::makeLocalSet
                            (&local_38,*pmVar20,
                             *(Expression **)
                              ((this_01->
                               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               ).
                               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               .stack.fixed._M_elems[0].func +
                              (long)((ulong)contents & 0xffffffff) * 8));
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar21->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar23);
        uVar14 = (int)contents + 1;
        contents = (Expression *)CONCAT44(contents._4_4_,uVar14);
      } while (uVar14 < sVar18);
      pBVar24 = (Break *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
      (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar24->name).super_IString.str._M_len = 0;
      (pBVar24->name).super_IString.str._M_str = (char *)0x0;
      pBVar24->value = (Expression *)0x0;
      pBVar24->condition = (Expression *)0x0;
      (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar24->name).super_IString.str._M_len = name.field_2._8_8_;
      (pBVar24->name).super_IString.str._M_str = sVar39._M_str;
      pBVar24->value = (Expression *)0x0;
      pBVar24->condition = (Expression *)0x0;
      Break::finalize(pBVar24);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar21->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar24);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)0x1;
      Block::finalize(pBVar21,type_,Unknown);
    }
    *action->callSite = (Expression *)pBVar21;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_98);
  }
  auStack_98 = (undefined1  [8])0x0;
  __str._M_dataplus._M_p = (pointer)0x0;
  __str.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
       ::_M_invoke;
  __str._M_string_length =
       (size_type)
       std::
       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
       ::_M_manager;
  local_d0 = (Block *)ExpressionManipulator::flexibleCopy
                                (this_02->body,local_a8,(CustomCopier *)auStack_98);
  if (__str._M_string_length != 0) {
    (*(code *)__str._M_string_length)(auStack_98,auStack_98,3);
  }
  debuginfo::copyBetweenFunctions(this_02->body,(Expression *)local_d0,this_02,into);
  if (((long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Updater, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Updater>]"
                 );
  }
  Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              *)auStack_2e8,
             TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             ::scan,(Expression **)&local_d0);
  pfVar30 = (function<bool_(wasm::Name)> *)
            (((long)updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
            (long)updater.
                  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                  .replacep);
  if (pfVar30 != (function<bool_(wasm::Name)> *)0x0) {
    do {
      if ((pointer)updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          updater.
          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, N = 10]"
                       );
        }
        pTVar35 = (pointer)&updater.
                            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .stack.fixed._M_elems
                            [(long)updater.
                                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                                   .
                                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                                   .replacep + -2].currp;
      }
      else {
        pTVar35 = updater.
                  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                  .stack.flexible.
                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar4 = pTVar35->currp;
      if ((pointer)updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          updater.
          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, N = 10]"
                       );
        }
        updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .replacep = (Expression **)
                    ((long)updater.
                           super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .replacep + -1);
      }
      else {
        updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_2e8 = (undefined1  [8])ppEVar4;
      if (*ppEVar4 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Updater, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Updater>]"
                     );
      }
      (*pTVar35->func)((Updater *)auStack_2e8,ppEVar4);
      pfVar30 = (function<bool_(wasm::Name)> *)
                (((long)updater.
                        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)updater.
                        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .stack.fixed._M_elems[9].currp >> 4) +
                (long)updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .replacep);
    } while (pfVar30 != (function<bool_(wasm::Name)> *)0x0);
  }
  if (updater.options !=
      (PassOptions *)
      updater.returnCallInfos.
      super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pBVar21 = (Block *)0x0;
    if ((local_d0 != (Block *)0x0) &&
       ((local_d0->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
        BlockId)) {
      pBVar21 = local_d0;
    }
    if (pBVar21 == (Block *)0x0) {
      pBVar21 = Builder::makeBlock((Builder *)updater._304_8_,(Expression *)local_d0);
    }
    local_d0 = pBVar21;
    BranchUtils::BranchAccumulator::get((NameSet *)auStack_98,(Expression *)pBVar21);
    if ((PassOptions *)
        updater.returnCallInfos.
        super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
        ._M_impl.super__Vector_impl_data._M_start != updater.options) {
      items = &pBVar21->list;
      local_50 = (function<bool_(wasm::Name)> *)0x0;
      do {
        pPVar8 = updater.options;
        sVar39 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xdffcef),SUB81(pfVar30,0));
        sStack_c0 = 0;
        pcStack_b0 = std::
                     _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:424:26)>
                     ::_M_invoke;
        local_b8 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:424:26)>
                   ::_M_manager;
        local_120._id = StackSwitchId;
        local_120._1_1_ = 0;
        local_130.type.id = 1;
        root_01.super_IString.str._M_str = (char *)&contents;
        root_01.super_IString.str._M_len = (size_t)sVar39._M_str;
        local_130._0_8_ = &local_120;
        contents = (Expression *)auStack_98;
        _auStack_110 = (string_view)
                       Names::getValidName((Names *)sVar39._M_len,root_01,local_50,(Index)&local_130
                                           ,in_R9);
        if ((Expression *)local_130._0_8_ != &local_120) {
          operator_delete((void *)local_130._0_8_,CONCAT62(local_120._2_6_,local_120._0_2_) + 1);
        }
        if (local_b8 != (code *)0x0) {
          (*local_b8)(&contents,&contents,3);
        }
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)auStack_98,(Name *)auStack_110);
        lVar5 = *(long *)(&pPVar8->debug + (long)local_50 * 0x10 + 8);
        *(undefined1 (*) [8])(lVar5 + 0x10) = auStack_110;
        *(size_t *)(lVar5 + 0x18) = name_1.super_IString.str._M_len;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)
             (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
        pBVar25 = Builder::makeBlock<ArenaVector<wasm::Expression_*>,_true>
                            ((Builder *)updater._304_8_,items,type);
        sVar7 = updater.returnName.super_IString.str._M_len;
        sVar18 = updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
        (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements = 0;
        if (updater.returnName.super_IString.str._M_str < (char *)0x2) {
          pBVar24 = (Break *)MixedArena::allocSpace
                                       ((MixedArena *)(*(long *)updater._304_8_ + 0x200),0x30,8);
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
          (pBVar24->name).super_IString.str._M_len = 0;
          (pBVar24->name).super_IString.str._M_str = (char *)0x0;
          pBVar24->value = (Expression *)0x0;
          pBVar24->condition = (Expression *)0x0;
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (pBVar24->name).super_IString.str._M_len = sVar18;
          (pBVar24->name).super_IString.str._M_str = (char *)sVar7;
          pBVar24->value = (Expression *)0x0;
          pBVar24->condition = (Expression *)0x0;
          Break::finalize(pBVar24);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar25->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pBVar24);
          (pBVar25->name).super_IString.str._M_len = (size_t)auStack_110;
          (pBVar25->name).super_IString.str._M_str = (char *)name_1.super_IString.str._M_len;
          (pBVar25->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&items->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pBVar25);
        }
        else {
          name.field_2._8_8_ = auStack_110;
          sVar9 = name_1.super_IString.str._M_len;
          local_a8 = (Module *)updater._304_8_;
          pBVar24 = (Break *)MixedArena::allocSpace
                                       ((MixedArena *)(*(long *)updater._304_8_ + 0x200),0x30,8);
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
          (pBVar24->name).super_IString.str._M_len = 0;
          (pBVar24->name).super_IString.str._M_str = (char *)0x0;
          pBVar24->value = (Expression *)0x0;
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (pBVar24->name).super_IString.str._M_len = sVar18;
          (pBVar24->name).super_IString.str._M_str = (char *)sVar7;
          pBVar24->value = (Expression *)pBVar25;
          pBVar24->condition = (Expression *)0x0;
          Break::finalize(pBVar24);
          local_338._M_array =
               (iterator)
               &updater.returnCallInfos.
                super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_338._M_len = 1;
          name_00.super_IString.str._M_str = (char *)sVar9;
          name_00.super_IString.str._M_len = name.field_2._8_8_;
          in_R9 = (string *)0x1;
          updater.returnCallInfos.
          super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pBVar24;
          pBVar25 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                              ((Builder *)local_a8,name_00,&local_338,
                               (optional<wasm::Type>)(ZEXT816(1) << 0x40));
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&items->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pBVar25);
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&items->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   *(Expression **)(&pPVar8->debug + (long)local_50 * 0x10));
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)updater.returnName.super_IString.str._M_str;
        Block::finalize(pBVar21,type__00,Unknown);
        pfVar30 = (function<bool_(wasm::Name)> *)(ulong)((int)local_50 + 1);
        local_50 = pfVar30;
      } while (pfVar30 < (function<bool_(wasm::Name)> *)
                         ((long)updater.returnCallInfos.
                                super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)updater.options >>
                         4));
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_98);
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type,
             (Expression *)local_d0);
  pTVar31->id = (uintptr_t)local_a0;
  if (((this_01->
       super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
       ).
       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
       .stack.usedFixed == 1) &&
     (*(char *)&(this_01->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.fixed._M_elems[3].func == '\0')) {
    local_48 = left;
    if (1 < (ulong)local_a0) {
      local_48 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (local_48->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (local_48->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      local_48->value = (Expression *)left;
      Drop::finalize(local_48);
    }
    pEVar26 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
    pEVar26->_id = UnreachableId;
    (pEVar26->type).id = 1;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pTVar31;
    pBVar21 = Builder::makeSequence(&local_38,(Expression *)local_48,pEVar26,type_02);
    *action->callSite = (Expression *)pBVar21;
  }
  if (updater.options != (PassOptions *)0x0) {
    operator_delete(updater.options,
                    (long)updater.returnCallInfos.
                          super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)updater.options);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)&updater.module);
  if (updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  if ((size_type *)name_1.super_IString.str._M_str != &name._M_string_length) {
    operator_delete(name_1.super_IString.str._M_str,name._M_string_length + 1);
  }
  return;
}

Assistant:

static void doCodeInlining(Module* module,
                           Function* into,
                           const InliningAction& action,
                           PassOptions& options) {
  Function* from = action.contents;
  auto* call = (*action.callSite)->cast<Call>();

  // Works for return_call, too
  Type retType = module->getFunction(call->target)->getResults();

  // Build the block that will contain the inlined contents.
  Builder builder(*module);
  auto* block = builder.makeBlock();
  auto name = std::string("__inlined_func$") + from->name.toString();
  if (action.nameHint) {
    name += '$' + std::to_string(action.nameHint);
  }
  block->name = Name(name);

  // In the unlikely event that the function already has a branch target with
  // this name, fix that up, as otherwise we can get unexpected capture of our
  // branches, that is, we could end up with this:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (from's contents
  //      (block $X         ;; a block in from's contents with a colliding name
  //        (br $X          ;; a new br we just added that replaces a return
  //
  // Here the br wants to go to the very outermost block, to represent a
  // return from the inlined function's code, but it ends up captured by an
  // internal block. We also need to be careful of the call's children:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (local.set $param
  //      (call's first parameter
  //        (br $X)         ;; nested br in call's first parameter
  //      )
  //    )
  //
  // (In this case we could use a second block and define the named block $X
  // after the call's parameters, but that adds work for an extremely rare
  // situation.) The latter case does not apply if the call is a
  // return_call inside a try, because in that case the call's
  // children do not appear inside the same block as the inlined body.
  bool hoistCall = call->isReturn && action.insideATry;
  if (BranchUtils::hasBranchTarget(from->body, block->name) ||
      (!hoistCall && BranchUtils::BranchSeeker::has(call, block->name))) {
    auto fromNames = BranchUtils::getBranchTargets(from->body);
    auto callNames = hoistCall ? BranchUtils::NameSet{}
                               : BranchUtils::BranchAccumulator::get(call);
    block->name = Names::getValidName(block->name, [&](Name test) {
      return !fromNames.count(test) && !callNames.count(test);
    });
  }

  // Prepare to update the inlined code's locals and other things.
  Updater updater(options);
  updater.setFunction(into);
  updater.module = module;
  updater.resultType = from->getResults();
  updater.returnName = block->name;
  updater.isReturn = call->isReturn;
  updater.builder = &builder;
  // Set up a locals mapping
  for (Index i = 0; i < from->getNumLocals(); i++) {
    updater.localMapping[i] = builder.addVar(into, from->getLocalType(i));
  }

  if (hoistCall) {
    // Wrap the existing function body in a block we can branch out of before
    // entering the inlined function body. This block must have a name that is
    // different from any other block name above the branch.
    auto intoNames = BranchUtils::BranchAccumulator::get(into->body);
    auto bodyName =
      Names::getValidName(Name("__original_body"),
                          [&](Name test) { return !intoNames.count(test); });
    if (retType.isConcrete()) {
      into->body = builder.makeBlock(
        bodyName, {builder.makeReturn(into->body)}, Type::none);
    } else {
      into->body = builder.makeBlock(
        bodyName, {into->body, builder.makeReturn()}, Type::none);
    }

    // Sequence the inlined function body after the original caller body.
    into->body = builder.makeSequence(into->body, block, retType);

    // Replace the original callsite with an expression that assigns the
    // operands into the params and branches out of the original body.
    auto numParams = from->getParams().size();
    if (numParams) {
      auto* branchBlock = builder.makeBlock();
      for (Index i = 0; i < numParams; i++) {
        branchBlock->list.push_back(
          builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
      }
      branchBlock->list.push_back(builder.makeBreak(bodyName));
      branchBlock->finalize(Type::unreachable);
      *action.callSite = branchBlock;
    } else {
      *action.callSite = builder.makeBreak(bodyName);
    }
  } else {
    // Assign the operands into the params
    for (Index i = 0; i < from->getParams().size(); i++) {
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
    }
    // Zero out the vars (as we may be in a loop, and may depend on their
    // zero-init value
    for (Index i = 0; i < from->vars.size(); i++) {
      auto type = from->vars[i];
      if (!LiteralUtils::canMakeZero(type)) {
        // Non-zeroable locals do not need to be zeroed out. As they have no
        // zero value they by definition should not be used before being written
        // to, so any value we set here would not be observed anyhow.
        continue;
      }
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[from->getVarIndexBase() + i],
                             LiteralUtils::makeZero(type, *module)));
    }
    if (call->isReturn) {
      assert(!action.insideATry);
      if (retType.isConcrete()) {
        *action.callSite = builder.makeReturn(block);
      } else {
        *action.callSite = builder.makeSequence(block, builder.makeReturn());
      }
    } else {
      *action.callSite = block;
    }
  }

  // Generate and update the inlined contents
  auto* contents = ExpressionManipulator::copy(from->body, *module);
  debuginfo::copyBetweenFunctions(from->body, contents, from, into);
  updater.walk(contents);
  block->list.push_back(contents);
  block->type = retType;

  // The ReFinalize below will handle propagating unreachability if we need to
  // do so, that is, if the call was reachable but now the inlined content we
  // replaced it with was unreachable. The opposite case requires special
  // handling: ReFinalize works under the assumption that code can become
  // unreachable, but it does not go back from that state. But inlining can
  // cause that:
  //
  //  (call $A                               ;; an unreachable call
  //    (unreachable)
  //  )
  // =>
  //  (block $__inlined_A_body (result i32)  ;; reachable code after inlining
  //    (unreachable)
  //  )
  //
  // That is, if the called function wraps the input parameter in a block with a
  // declared type, then the block is not unreachable. And then we might error
  // if the outside expects the code to be unreachable - perhaps it only
  // validates that way. To fix this, if the call was unreachable then we make
  // the inlined code unreachable as well. That also maximizes DCE
  // opportunities by propagating unreachability as much as possible.
  //
  // (Note that we don't need to do this for a return_call, which is always
  // unreachable anyhow.)
  if (call->type == Type::unreachable && !call->isReturn) {
    // Make the replacement code unreachable. Note that we can't just add an
    // unreachable at the end, as the block might have breaks to it (returns are
    // transformed into those).
    Expression* old = block;
    if (old->type.isConcrete()) {
      old = builder.makeDrop(old);
    }
    *action.callSite = builder.makeSequence(old, builder.makeUnreachable());
  }
}